

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoConvert<long,int>(Thread *this,Ptr *out_trap)

{
  Store *store;
  bool bVar1;
  long value;
  allocator local_61;
  string local_60;
  Ptr local_40;
  int local_24;
  Ptr *pPStack_20;
  int val;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pPStack_20 = out_trap;
  out_trap_local = (Ptr *)this;
  local_24 = Pop<int>(this);
  bVar1 = CanConvert<long,int>(local_24);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    value = Convert<long,int>(local_24);
    Push<long>(this,value);
    this_local._4_4_ = Ok;
  }
  else {
    store = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"integer overflow",&local_61);
    Trap::New(&local_40,store,&local_60,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=(pPStack_20,&local_40);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}